

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_IndexSpaceI.H
# Opt level: O3

void __thiscall
amrex::EB2::
IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>
::IndexSpaceImp(IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>
                *this,GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>
                      *gshop,Geometry *geom,int required_coarsening_level,int max_coarsening_level,
               int ngrow,bool build_coarse_level_by_coarsening,bool extend_domain_face,
               int num_coarsen_opt)

{
  Vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>_>_>
  *this_00;
  pointer *ppGVar1;
  pointer *ppBVar2;
  Real *pRVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  pointer pGVar7;
  pointer pGVar8;
  uint uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>_>_>
  *pvVar13;
  vector<amrex::Box,_std::allocator<amrex::Box>_> *pvVar14;
  vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *pvVar15;
  vector<int,_std::allocator<int>_> *pvVar16;
  bool bVar17;
  int iVar18;
  uint uVar19;
  long *plVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  Real *pRVar24;
  size_type *psVar25;
  int iVar26;
  uint uVar27;
  GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int> *pGVar28;
  GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int> *pGVar29;
  Level *this_01;
  uint uVar30;
  bool extend_domain_face_local;
  uint local_198;
  int ng;
  int local_190;
  int local_18c;
  string __str;
  Box result;
  long *local_118 [2];
  long local_108 [2];
  Geometry cgeom;
  
  extend_domain_face_local = extend_domain_face;
  (this->super_IndexSpace)._vptr_IndexSpace = (_func_int **)&PTR__IndexSpaceImp_00713278;
  pGVar28 = gshop;
  pGVar29 = &this->m_gshop;
  for (lVar22 = 0xe; lVar22 != 0; lVar22 = lVar22 + -1) {
    (pGVar29->m_f).m_f.m_lo.x = (pGVar28->m_f).m_f.m_lo.x;
    pGVar28 = (GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int> *)
              &(pGVar28->m_f).m_f.m_lo.y;
    pGVar29 = (GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int> *)
              &(pGVar29->m_f).m_f.m_lo.y;
  }
  (this->m_gshop).m_resource = gshop->m_resource;
  this->m_build_coarse_level_by_coarsening = build_coarse_level_by_coarsening;
  this->m_extend_domain_face = extend_domain_face;
  this->m_num_coarsen_opt = num_coarsen_opt;
  this_00 = &this->m_gslevel;
  pvVar13 = &(this->m_gslevel).
             super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>_>_>
  ;
  (pvVar13->
  super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar13->
  super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->m_gslevel).
    super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>_>_>
    .
    super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  pvVar15 = &(this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  (pvVar15->super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar15->super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar14 = &(this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>;
  (pvVar14->super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar14->super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (undefined1  [16])0x0;
  pvVar16 = &(this->m_ngrow).super_vector<int,_std::allocator<int>_>;
  (pvVar16->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (pvVar16->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_18c = required_coarsening_level;
  if (0x1e < (uint)required_coarsening_level) {
    Assert_host("required_coarsening_level >= 0 && required_coarsening_level <= 30",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EB2_IndexSpaceI.H"
                ,0xe,(char *)0x0);
  }
  iVar26 = local_18c;
  if (max_coarsening_level < local_18c) {
    max_coarsening_level = local_18c;
  }
  iVar18 = 0x1e;
  if (max_coarsening_level < 0x1e) {
    iVar18 = max_coarsening_level;
  }
  local_190 = 0;
  if (0 < ngrow) {
    local_190 = ngrow;
  }
  iVar21 = local_18c;
  if (0 < local_18c) {
    do {
      local_190 = local_190 * 2;
      iVar21 = iVar21 + -1;
    } while (iVar21 != 0);
  }
  iVar4._M_current =
       (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
      super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>::
    _M_realloc_insert<amrex::Geometry_const&>
              ((vector<amrex::Geometry,std::allocator<amrex::Geometry>> *)&this->m_geom,iVar4,geom);
  }
  else {
    memcpy(iVar4._M_current,geom,200);
    ppGVar1 = &(this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppGVar1 = *ppGVar1 + 1;
  }
  iVar5._M_current =
       (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar5._M_current ==
      (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
              ((vector<amrex::Box,std::allocator<amrex::Box>> *)&this->m_domain,iVar5,&geom->domain)
    ;
  }
  else {
    uVar10 = *(undefined8 *)(geom->domain).smallend.vect;
    uVar11 = *(undefined8 *)((geom->domain).smallend.vect + 2);
    uVar12 = *(undefined8 *)((geom->domain).bigend.vect + 2);
    *(undefined8 *)((iVar5._M_current)->bigend).vect = *(undefined8 *)(geom->domain).bigend.vect;
    *(undefined8 *)(((iVar5._M_current)->bigend).vect + 2) = uVar12;
    *(undefined8 *)((iVar5._M_current)->smallend).vect = uVar10;
    *(undefined8 *)(((iVar5._M_current)->smallend).vect + 2) = uVar11;
    ppBVar2 = &(this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppBVar2 = *ppBVar2 + 1;
  }
  iVar6._M_current =
       (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  if (iVar6._M_current ==
      (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->m_ngrow,iVar6,&local_190);
  }
  else {
    *iVar6._M_current = local_190;
    (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         iVar6._M_current + 1;
  }
  std::
  vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>_>_>
  ::reserve(&this_00->
             super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>_>_>
            ,(long)(iVar18 + 1));
  cgeom.super_CoordSys._0_8_ = this;
  std::
  vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,amrex::EB2::BoxIF>,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,amrex::EB2::BoxIF>,int>>>>
  ::
  emplace_back<amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,amrex::EB2::BoxIF>,int>>*,amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,amrex::EB2::BoxIF>,int>const&,amrex::Geometry_const&,int&,int&,bool&,int&>
            ((vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,amrex::EB2::BoxIF>,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,amrex::EB2::BoxIF>,int>>>>
              *)this_00,
             (IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>
              **)&cgeom,gshop,geom,&EB2::max_grid_size,&local_190,&extend_domain_face_local,
             &num_coarsen_opt);
  local_198 = 1;
  if (0 < max_coarsening_level) {
    do {
      cgeom.super_CoordSys.c_sys = SPHERICAL;
      cgeom.super_CoordSys._4_4_ = 2;
      cgeom.super_CoordSys.offset[0] = (Real)CONCAT44(cgeom.super_CoordSys.offset[0]._4_4_,2);
      __str._M_dataplus._M_p = (pointer)0x200000002;
      __str._M_string_length = CONCAT44(__str._M_string_length._4_4_,2);
      bVar17 = Box::coarsenable(&(this->m_geom).
                                 super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                 super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                 ._M_impl.super__Vector_impl_data._M_finish[-1].domain,
                                (IntVect *)&cgeom,(IntVect *)&__str);
      if (!bVar17) {
        if (iVar26 < (int)local_198) {
          return;
        }
        uVar9 = -local_198;
        if (0 < (int)local_198) {
          uVar9 = local_198;
        }
        uVar27 = 1;
        if (9 < uVar9) {
          uVar23 = (ulong)uVar9;
          uVar30 = 4;
          do {
            uVar27 = uVar30;
            uVar19 = (uint)uVar23;
            if (uVar19 < 100) {
              uVar27 = uVar27 - 2;
              goto LAB_00242be6;
            }
            if (uVar19 < 1000) {
              uVar27 = uVar27 - 1;
              goto LAB_00242be6;
            }
            if (uVar19 < 10000) goto LAB_00242be6;
            uVar23 = uVar23 / 10000;
            uVar30 = uVar27 + 4;
          } while (99999 < uVar19);
          uVar27 = uVar27 + 1;
        }
LAB_00242be6:
        uVar30 = local_198 >> 0x1f;
        __str._M_dataplus._M_p = (pointer)&__str.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&__str,(char)uVar27 - (char)((int)local_198 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (__str._M_dataplus._M_p + uVar30,uVar27,uVar9);
        plVar20 = (long *)std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x6648c5);
        iVar26 = local_18c;
        pRVar3 = cgeom.super_CoordSys.offset + 1;
        pRVar24 = (Real *)(plVar20 + 2);
        if ((Real *)*plVar20 == pRVar24) {
          cgeom.super_CoordSys.offset[1] = *pRVar24;
          cgeom.super_CoordSys.offset[2] = (Real)plVar20[3];
          cgeom.super_CoordSys._0_8_ = pRVar3;
        }
        else {
          cgeom.super_CoordSys.offset[1] = *pRVar24;
          cgeom.super_CoordSys._0_8_ = (Real *)*plVar20;
        }
        cgeom.super_CoordSys.offset[0] = (Real)plVar20[1];
        *plVar20 = (long)pRVar24;
        plVar20[1] = 0;
        *(undefined1 *)(plVar20 + 2) = 0;
        Abort((string *)&cgeom);
        if ((Real *)cgeom.super_CoordSys._0_8_ != pRVar3) {
          operator_delete((void *)cgeom.super_CoordSys._0_8_,
                          (long)cgeom.super_CoordSys.offset[1] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != &__str.field_2) {
          operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
        }
      }
      ng = 0;
      if ((int)local_198 <= iVar26) {
        ng = (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
             [-1] / 2;
      }
      pGVar7 = (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uVar10 = *(undefined8 *)pGVar7[-1].domain.smallend.vect;
      uVar11 = *(undefined8 *)(pGVar7[-1].domain.smallend.vect + 2);
      uVar12 = *(undefined8 *)(pGVar7[-1].domain.bigend.vect + 2);
      result.bigend.vect[2] = (int)uVar12;
      result.btype.itype = SUB84(uVar12,4);
      result.smallend.vect[2] = (int)uVar11;
      result.smallend.vect[0] = (int)uVar10 >> 1;
      result.smallend.vect[1] = (int)((long)uVar10 >> 0x21);
      result.smallend.vect[2] = result.smallend.vect[2] >> 1;
      __str._M_dataplus._M_p = (pointer)0x200000002;
      __str._M_string_length = CONCAT44(__str._M_string_length._4_4_,2);
      result.btype.itype = SUB84(uVar12,4);
      result.bigend.vect[2] = (int)uVar12;
      result.bigend.vect[2] = result.bigend.vect[2] >> 1;
      result.bigend.vect[0] = (int)((long)uVar11 >> 0x21);
      result.bigend.vect[1] = (int)((long)*(undefined8 *)pGVar7[-1].domain.bigend.vect >> 0x21);
      if (result.btype.itype != 0) {
        cgeom.super_CoordSys.c_sys = cartesian;
        cgeom.super_CoordSys._4_4_ = 0;
        cgeom.super_CoordSys.offset[0] =
             (Real)((ulong)cgeom.super_CoordSys.offset[0] & 0xffffffff00000000);
        lVar22 = 0;
        do {
          if (((result.btype.itype >> ((uint)lVar22 & 0x1f) & 1) != 0) &&
             (result.bigend.vect[lVar22] % result.smallend.vect[lVar22 + -8] != 0)) {
            *(undefined4 *)((long)cgeom.super_CoordSys.offset + lVar22 * 4 + -8) = 1;
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != 3);
        result.bigend.vect[0] = cgeom.super_CoordSys.c_sys + result.bigend.vect[0];
        result.bigend.vect[1] = cgeom.super_CoordSys._4_4_ + result.bigend.vect[1];
        result.bigend.vect[2] = result.bigend.vect[2] + cgeom.super_CoordSys.offset[0]._0_4_;
      }
      __str._M_dataplus._M_p = (pointer)0x200000002;
      __str._M_string_length = CONCAT44(__str._M_string_length._4_4_,2);
      memcpy(&cgeom,pGVar7 + -1,200);
      Geometry::coarsen(&cgeom,(IntVect *)&__str);
      __str._M_dataplus._M_p = (pointer)this;
      std::
      vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,amrex::EB2::BoxIF>,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,amrex::EB2::BoxIF>,int>>>>
      ::
      emplace_back<amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,amrex::EB2::BoxIF>,int>>*,int&,int&,int&,amrex::Geometry&,amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,amrex::EB2::BoxIF>,int>>&>
                ((vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,amrex::EB2::BoxIF>,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,amrex::EB2::BoxIF>,int>>>>
                  *)this_00,
                 (IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>
                  **)&__str,(int *)&local_198,&EB2::max_grid_size,&ng,&cgeom,
                 (this->m_gslevel).
                 super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>_>_>
                 .
                 super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (long)(int)local_198 + -1);
      pGVar8 = (this->m_gslevel).
               super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>_>_>
               .
               super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pGVar8[-1].super_Level.m_ok == false) {
        this_01 = &pGVar8[-1].super_Level;
        (this->m_gslevel).
        super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>_>_>
        .
        super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)this_01;
        Level::~Level(this_01);
        if (iVar26 < (int)local_198) {
          return;
        }
        if (build_coarse_level_by_coarsening) {
          uVar9 = -local_198;
          if (0 < (int)local_198) {
            uVar9 = local_198;
          }
          uVar27 = 1;
          if (9 < uVar9) {
            uVar23 = (ulong)uVar9;
            uVar30 = 4;
            do {
              uVar27 = uVar30;
              uVar19 = (uint)uVar23;
              if (uVar19 < 100) {
                uVar27 = uVar27 - 2;
                goto LAB_00242f2b;
              }
              if (uVar19 < 1000) {
                uVar27 = uVar27 - 1;
                goto LAB_00242f2b;
              }
              if (uVar19 < 10000) goto LAB_00242f2b;
              uVar23 = uVar23 / 10000;
              uVar30 = uVar27 + 4;
            } while (99999 < uVar19);
            uVar27 = uVar27 + 1;
          }
LAB_00242f2b:
          uVar30 = local_198 >> 0x1f;
          local_118[0] = local_108;
          std::__cxx11::string::_M_construct
                    ((ulong)local_118,(char)uVar27 - (char)((int)local_198 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)uVar30 + (long)local_118[0]),uVar27,uVar9);
          plVar20 = (long *)std::__cxx11::string::replace((ulong)local_118,0,(char *)0x0,0x6648f8);
          iVar26 = local_18c;
          __str._M_dataplus._M_p = (pointer)&__str.field_2;
          psVar25 = (size_type *)(plVar20 + 2);
          if ((size_type *)*plVar20 == psVar25) {
            __str.field_2._M_allocated_capacity = *psVar25;
            __str.field_2._8_8_ = plVar20[3];
          }
          else {
            __str.field_2._M_allocated_capacity = *psVar25;
            __str._M_dataplus._M_p = (pointer)*plVar20;
          }
          __str._M_string_length = plVar20[1];
          *plVar20 = (long)psVar25;
          plVar20[1] = 0;
          *(undefined1 *)(plVar20 + 2) = 0;
          Abort(&__str);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
          }
          if (local_118[0] != local_108) {
            operator_delete(local_118[0],local_108[0] + 1);
          }
        }
        else {
          local_118[0] = (long *)CONCAT44(local_118[0]._4_4_,num_coarsen_opt - local_198);
          __str._M_dataplus._M_p = (pointer)this;
          std::
          vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,amrex::EB2::BoxIF>,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,amrex::EB2::BoxIF>,int>>>>
          ::
          emplace_back<amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,amrex::EB2::BoxIF>,int>>*,amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,amrex::EB2::BoxIF>,int>const&,amrex::Geometry&,int&,int&,bool&,int>
                    ((vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,amrex::EB2::BoxIF>,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,amrex::EB2::BoxIF>,int>>>>
                      *)this_00,
                     (IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>
                      **)&__str,gshop,&cgeom,&EB2::max_grid_size,&ng,&extend_domain_face_local,
                     (int *)local_118);
        }
      }
      iVar4._M_current =
           (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
          super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>::
        _M_realloc_insert<amrex::Geometry_const&>
                  ((vector<amrex::Geometry,std::allocator<amrex::Geometry>> *)&this->m_geom,iVar4,
                   &cgeom);
      }
      else {
        memcpy(iVar4._M_current,&cgeom,200);
        ppGVar1 = &(this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                   super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppGVar1 = *ppGVar1 + 1;
      }
      iVar5._M_current =
           (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
                  ((vector<amrex::Box,std::allocator<amrex::Box>> *)&this->m_domain,iVar5,&result);
      }
      else {
        *(ulong *)((iVar5._M_current)->bigend).vect =
             CONCAT44(result.bigend.vect[1],result.bigend.vect[0]);
        *(undefined8 *)(((iVar5._M_current)->bigend).vect + 2) = result._20_8_;
        *(undefined8 *)((iVar5._M_current)->smallend).vect = result.smallend.vect._0_8_;
        *(ulong *)(((iVar5._M_current)->smallend).vect + 2) =
             CONCAT44(result.bigend.vect[0],result.smallend.vect[2]);
        ppBVar2 = &(this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppBVar2 = *ppBVar2 + 1;
      }
      iVar6._M_current =
           (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->m_ngrow,iVar6,&ng);
      }
      else {
        *iVar6._M_current = ng;
        (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             iVar6._M_current + 1;
      }
      bVar17 = (int)local_198 < iVar18;
      local_198 = local_198 + 1;
    } while (bVar17);
  }
  return;
}

Assistant:

IndexSpaceImp<G>::IndexSpaceImp (const G& gshop, const Geometry& geom,
                                 int required_coarsening_level,
                                 int max_coarsening_level,
                                 int ngrow, bool build_coarse_level_by_coarsening,
                                 bool extend_domain_face, int num_coarsen_opt)
    : m_gshop(gshop),
      m_build_coarse_level_by_coarsening(build_coarse_level_by_coarsening),
      m_extend_domain_face(extend_domain_face),
      m_num_coarsen_opt(num_coarsen_opt)
{
    // build finest level (i.e., level 0) first
    AMREX_ALWAYS_ASSERT(required_coarsening_level >= 0 && required_coarsening_level <= 30);
    max_coarsening_level = std::max(required_coarsening_level,max_coarsening_level);
    max_coarsening_level = std::min(30,max_coarsening_level);

    int ngrow_finest = std::max(ngrow,0);
    for (int i = 1; i <= required_coarsening_level; ++i) {
        ngrow_finest *= 2;
    }

    m_geom.push_back(geom);
    m_domain.push_back(geom.Domain());
    m_ngrow.push_back(ngrow_finest);
    m_gslevel.reserve(max_coarsening_level+1);
    m_gslevel.emplace_back(this, gshop, geom, EB2::max_grid_size, ngrow_finest, extend_domain_face,
                           num_coarsen_opt);

    for (int ilev = 1; ilev <= max_coarsening_level; ++ilev)
    {
        bool coarsenable = m_geom.back().Domain().coarsenable(2,2);
        if (!coarsenable) {
            if (ilev <= required_coarsening_level) {
                amrex::Abort("IndexSpaceImp: domain is not coarsenable at level "+std::to_string(ilev));
            } else {
                break;
            }
        }

        int ng = (ilev > required_coarsening_level) ? 0 : m_ngrow.back()/2;

        Box cdomain = amrex::coarsen(m_geom.back().Domain(),2);
        Geometry cgeom = amrex::coarsen(m_geom.back(),2);
        m_gslevel.emplace_back(this, ilev, EB2::max_grid_size, ng, cgeom, m_gslevel[ilev-1]);
        if (!m_gslevel.back().isOK()) {
            m_gslevel.pop_back();
            if (ilev <= required_coarsening_level) {
                if (build_coarse_level_by_coarsening) {
                    amrex::Abort("Failed to build required coarse EB level "+std::to_string(ilev));
                } else {
                    m_gslevel.emplace_back(this, gshop, cgeom, EB2::max_grid_size, ng, extend_domain_face,
                                           num_coarsen_opt-ilev);
                }
            } else {
                break;
            }
        }
        m_geom.push_back(cgeom);
        m_domain.push_back(cdomain);
        m_ngrow.push_back(ng);
    }
}